

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# par2lpc.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  string *this;
  char *__s;
  long lVar5;
  bool bVar6;
  int num_order;
  Buffer buffer;
  ParcorCoefficientsToLinearPredictiveCoefficients
  parcor_coefficients_to_linear_predictive_coefficients;
  vector<double,_std::allocator<double>_> coefficients;
  ostringstream error_message_3;
  ifstream ifs;
  int local_41c;
  string local_418;
  string local_3f8;
  ParcorCoefficientsToLinearPredictiveCoefficients local_3d8;
  vector<double,_std::allocator<double>_> local_3c8;
  string local_3b0 [3];
  ios_base local_340 [264];
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_41c = 0x19;
  while (iVar3 = ya_getopt_long(argc,argv,"m:h",(option *)0x0,(int *)0x0), iVar3 == 0x6d) {
    std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
    bVar1 = sptk::ConvertStringToInteger(&local_238,&local_41c);
    bVar6 = local_41c < 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if (!bVar1 || bVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -m option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"non-negative integer",0x14);
      local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"par2lpc","");
      sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
LAB_001039c2:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
        operator_delete(local_3b0[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      return 1;
    }
  }
  if (iVar3 != -1) {
    if (iVar3 != 0x68) {
      anon_unknown.dwarf_2bae::PrintUsage((ostream *)&std::cerr);
      return 1;
    }
    anon_unknown.dwarf_2bae::PrintUsage((ostream *)&std::cout);
    return 0;
  }
  if (1 < argc - ya_optind) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Too many input files",0x14);
    local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"par2lpc","");
    sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
    goto LAB_001039c2;
  }
  if (argc == ya_optind) {
    __s = (char *)0x0;
  }
  else {
    __s = argv[ya_optind];
  }
  bVar1 = sptk::SetBinaryMode();
  this = &local_238;
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"Cannot set translation mode",0x1b);
    local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"par2lpc","");
    sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
    goto LAB_001039c2;
  }
  std::ifstream::ifstream(this);
  if ((__s == (char *)0x0) ||
     (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
     (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0)) {
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      this = (string *)&std::cin;
    }
    sptk::ParcorCoefficientsToLinearPredictiveCoefficients::
    ParcorCoefficientsToLinearPredictiveCoefficients(&local_3d8,local_41c);
    local_3f8._M_dataplus._M_p = (pointer)&PTR__Buffer_0010fc98;
    local_3f8._M_string_length = 0;
    local_3f8.field_2._M_allocated_capacity = 0;
    local_3f8.field_2._8_8_ = 0;
    if (local_3d8.is_valid_ == false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b0,"Failed to initialize ",0x15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b0,"ParcorCoefficientsToLinearPredictiveCoefficients",0x30);
      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"par2lpc","");
      sptk::PrintErrorMessage(&local_418,(ostringstream *)local_3b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      std::ios_base::~ios_base(local_340);
      iVar3 = 1;
    }
    else {
      lVar5 = (long)local_41c;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_3c8,lVar5 + 1U,(allocator_type *)local_3b0);
      do {
        iVar3 = (int)(lVar5 + 1U);
        bVar1 = sptk::ReadStream<double>(false,0,0,iVar3,&local_3c8,(istream *)this,(int *)0x0);
        if (!bVar1) {
          iVar3 = 0;
          goto LAB_00103c6b;
        }
        bVar1 = sptk::ParcorCoefficientsToLinearPredictiveCoefficients::Run
                          (&local_3d8,&local_3c8,(Buffer *)&local_3f8);
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3b0,"Failed to convert PARCOR coefficients to ",0x29);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3b0,"linear predictive coefficients",0x1e);
          local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"par2lpc","");
          sptk::PrintErrorMessage(&local_418,(ostringstream *)local_3b0);
          goto LAB_00103c39;
        }
        bVar1 = sptk::WriteStream<double>(0,iVar3,&local_3c8,(ostream *)&std::cout,(int *)0x0);
      } while (bVar1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b0,"Failed to write linear predictive coefficients",0x2e);
      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"par2lpc","");
      sptk::PrintErrorMessage(&local_418,(ostringstream *)local_3b0);
LAB_00103c39:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      std::ios_base::~ios_base(local_340);
      iVar3 = 1;
LAB_00103c6b:
      if (local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    local_3f8._M_dataplus._M_p = (pointer)&PTR__Buffer_0010fc98;
    if ((void *)local_3f8._M_string_length != (void *)0x0) {
      operator_delete((void *)local_3f8._M_string_length);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"Cannot open file ",0x11);
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,__s,sVar4);
    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"par2lpc","");
    sptk::PrintErrorMessage(&local_3f8,(ostringstream *)local_3b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base(local_340);
    iVar3 = 1;
  }
  std::ifstream::~ifstream(&local_238);
  return iVar3;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("par2lpc", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("par2lpc", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("par2lpc", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("par2lpc", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::ParcorCoefficientsToLinearPredictiveCoefficients
      parcor_coefficients_to_linear_predictive_coefficients(num_order);
  sptk::ParcorCoefficientsToLinearPredictiveCoefficients::Buffer buffer;
  if (!parcor_coefficients_to_linear_predictive_coefficients.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize "
                  << "ParcorCoefficientsToLinearPredictiveCoefficients";
    sptk::PrintErrorMessage("par2lpc", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<double> coefficients(length);

  while (sptk::ReadStream(false, 0, 0, length, &coefficients, &input_stream,
                          NULL)) {
    if (!parcor_coefficients_to_linear_predictive_coefficients.Run(
            &coefficients, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to convert PARCOR coefficients to "
                    << "linear predictive coefficients";
      sptk::PrintErrorMessage("par2lpc", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, length, coefficients, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write linear predictive coefficients";
      sptk::PrintErrorMessage("par2lpc", error_message);
      return 1;
    }
  }

  return 0;
}